

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void dump(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *points,vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> *clusters)

{
  pointer puVar1;
  unsigned_long uVar2;
  pointer pvVar3;
  pointer pCVar4;
  pointer pCVar5;
  unsigned_long *index;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  
  pCVar4 = (clusters->
           super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pCVar5 = (clusters->
           super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if (pCVar5 != pCVar4) {
    uVar7 = 0;
    do {
      puVar6 = pCVar4[uVar7].members.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar1 = pCVar4[uVar7].members.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar6 != puVar1) {
        do {
          uVar2 = *puVar6;
          pvVar3 = (points->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          if (*(pointer *)
               ((long)&pvVar3[uVar2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data + 8) !=
              pvVar3[uVar2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start) {
            pvVar3 = pvVar3 + uVar2;
            uVar8 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
              std::ostream::_M_insert<double>
                        (*(double *)
                          (*(long *)&(pvVar3->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data + uVar8 * 8));
              uVar8 = uVar8 + 1;
            } while (uVar8 < (ulong)((long)*(pointer *)
                                            ((long)&(pvVar3->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + 8) -
                                     *(long *)&(pvVar3->
                                               super__Vector_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Vector_impl_data >> 3));
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
          std::ostream::put(-8);
          std::ostream::flush();
          puVar6 = puVar6 + 1;
        } while (puVar6 != puVar1);
        pCVar4 = (clusters->
                 super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pCVar5 = (clusters->
                 super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(((long)pCVar5 - (long)pCVar4 >> 4) * -0x5555555555555555));
  }
  return;
}

Assistant:

void dump(const std::vector<Container>& points,
    const std::vector<msc::Cluster<Scalar>>& clusters)
{
    for (std::size_t c = 0; c < clusters.size(); c++)
    {
        for (const auto& index : clusters[c].members)
        {
            const auto& point = points[index];
            std::cout << c;
            for (std::size_t k = 0; k < point.size(); k++)
                std::cout << " " << point[k];
            std::cout << std::endl;
        }
    }
}